

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scs.cpp
# Opt level: O1

bool Scs::Initialize(InitParams *params)

{
  InitializeInternal(params);
  return true;
}

Assistant:

bool Scs::Initialize(const InitParams & params)
{
	InitializeInternal(params);
#ifdef SCS_WINDOWS
	// Initialize Winsock v2.2
	int result = WSAStartup(MAKEWORD(2,2), &s_wsaData);
	if (result != 0)
	{
		LogWriteLine("WSAStartup failed: %d", result);
		return false;
	}
#endif
	return true;
}